

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psconv.c
# Opt level: O3

FT_Long PS_Conv_Strtol(FT_Byte **cursor,FT_Byte *limit,FT_Long base)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  byte *pbVar7;
  byte *pbVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  
  pbVar7 = *cursor;
  if (base - 0x25U < 0xffffffffffffffdd || limit <= pbVar7) {
    return 0;
  }
  bVar1 = *pbVar7;
  if ((bVar1 == 0x2d) || (bVar1 == 0x2b)) {
    pbVar7 = pbVar7 + 1;
    if (pbVar7 == limit) {
      return 0;
    }
    bVar12 = bVar1 == 0x2d;
    if (*pbVar7 == 0x2b) {
      return 0;
    }
    if (*pbVar7 == 0x2d) {
      return 0;
    }
  }
  else {
    bVar12 = false;
  }
  uVar5 = 0x7fffffff / (base & 0xffffffffU);
  pbVar8 = pbVar7;
  uVar11 = 0;
  if (pbVar7 < limit) {
    lVar10 = (long)limit - (long)pbVar7;
    uVar9 = 0;
    bVar2 = false;
    while( true ) {
      uVar11 = (ulong)*pbVar7;
      pbVar8 = pbVar7;
      if (((uVar11 < 0x21) && ((0x100003601U >> (uVar11 & 0x3f) & 1) != 0)) ||
         ((char)*pbVar7 < '\0')) break;
      lVar6 = (long)ft_char_table[uVar11];
      if ((lVar6 < 0) || (base <= lVar6)) break;
      uVar3 = uVar9;
      bVar4 = true;
      if (((long)uVar9 <= (long)uVar5) &&
         ((uVar9 != uVar5 ||
          (uVar3 = uVar5,
          (uint)(int)ft_char_table[uVar11] <= (uint)(0x7fffffff % (base & 0xffffffffU)))))) {
        uVar3 = uVar9 * base + lVar6;
        bVar4 = bVar2;
      }
      bVar2 = bVar4;
      uVar9 = uVar3;
      pbVar7 = pbVar7 + 1;
      lVar10 = lVar10 + -1;
      pbVar8 = limit;
      if (lVar10 == 0) break;
    }
    uVar11 = 0x7fffffff;
    if (!bVar2) {
      uVar11 = uVar9;
    }
  }
  *cursor = pbVar8;
  uVar5 = -uVar11;
  if (!bVar12) {
    uVar5 = uVar11;
  }
  return uVar5;
}

Assistant:

FT_LOCAL_DEF( FT_Long )
  PS_Conv_Strtol( FT_Byte**  cursor,
                  FT_Byte*   limit,
                  FT_Long    base )
  {
    FT_Byte*  p = *cursor;

    FT_Long   num           = 0;
    FT_Bool   sign          = 0;
    FT_Bool   have_overflow = 0;

    FT_Long   num_limit;
    FT_Char   c_limit;


    if ( p >= limit )
      goto Bad;

    if ( base < 2 || base > 36 )
    {
      FT_TRACE4(( "!!!INVALID BASE:!!!" ));
      return 0;
    }

    if ( *p == '-' || *p == '+' )
    {
      sign = FT_BOOL( *p == '-' );

      p++;
      if ( p == limit )
        goto Bad;

      /* only a single sign is allowed */
      if ( *p == '-' || *p == '+' )
        return 0;
    }

    num_limit = 0x7FFFFFFFL / base;
    c_limit   = (FT_Char)( 0x7FFFFFFFL % base );

    for ( ; p < limit; p++ )
    {
      FT_Char  c;


      if ( IS_PS_SPACE( *p ) || *p OP 0x80 )
        break;

      c = ft_char_table[*p & 0x7F];

      if ( c < 0 || c >= base )
        break;

      if ( num > num_limit || ( num == num_limit && c > c_limit ) )
        have_overflow = 1;
      else
        num = num * base + c;
    }

    *cursor = p;

    if ( have_overflow )
    {
      num = 0x7FFFFFFFL;
      FT_TRACE4(( "!!!OVERFLOW:!!!" ));
    }

    if ( sign )
      num = -num;

    return num;

  Bad:
    FT_TRACE4(( "!!!END OF DATA:!!!" ));
    return 0;
  }